

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O1

CTypeID ffi_checkctype(lua_State *L,CTState *cts,TValue *param)

{
  uint32_t uVar1;
  TValue *pTVar2;
  uint in_EAX;
  int errcode;
  CPState cp;
  CPState CStack_78;
  
  pTVar2 = L->base;
  if (L->top <= pTVar2) {
LAB_0012095b:
    lj_err_argtype(L,1,"C type");
  }
  uVar1 = (pTVar2->field_2).it;
  if (uVar1 == 0xfffffffb) {
    CStack_78.p = (char *)((ulong)(pTVar2->u32).lo + 0x10);
    CStack_78.mode = 0x12;
    CStack_78.L = L;
    CStack_78.cts = cts;
    CStack_78.param = param;
    CStack_78.srcname = CStack_78.p;
    errcode = lj_cparse(&CStack_78);
    if (errcode != 0) {
      lj_err_throw(L,errcode);
    }
  }
  else {
    CStack_78.val.id = in_EAX;
    if (uVar1 == 0xfffffff5) {
      if (param < L->top && param != (TValue *)0x0) {
        lj_err_arg(L,1,LJ_ERR_FFI_NUMPARAM);
      }
      CStack_78.val.id = (CTypeID)*(ushort *)((ulong)(pTVar2->u32).lo + 6);
      if (CStack_78.val.id == 0x15) {
        CStack_78.val.id = *(uint *)((ulong)(pTVar2->u32).lo + 8);
      }
    }
    if (uVar1 != 0xfffffff5) goto LAB_0012095b;
  }
  return CStack_78.val.id;
}

Assistant:

static CTypeID ffi_checkctype(lua_State *L, CTState *cts, TValue *param)
{
  TValue *o = L->base;
  if (!(o < L->top)) {
  err_argtype:
    lj_err_argtype(L, 1, "C type");
  }
  if (tvisstr(o)) {  /* Parse an abstract C type declaration. */
    GCstr *s = strV(o);
    CPState cp;
    int errcode;
    cp.L = L;
    cp.cts = cts;
    cp.srcname = strdata(s);
    cp.p = strdata(s);
    cp.param = param;
    cp.mode = CPARSE_MODE_ABSTRACT|CPARSE_MODE_NOIMPLICIT;
    errcode = lj_cparse(&cp);
    if (errcode) lj_err_throw(L, errcode);  /* Propagate errors. */
    return cp.val.id;
  } else {
    GCcdata *cd;
    if (!tviscdata(o)) goto err_argtype;
    if (param && param < L->top) lj_err_arg(L, 1, LJ_ERR_FFI_NUMPARAM);
    cd = cdataV(o);
    return cd->ctypeid == CTID_CTYPEID ? *(CTypeID *)cdataptr(cd) : cd->ctypeid;
  }
}